

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

bool vkt::anon_unknown_0::checkResultImage(ConstPixelBufferAccess *result)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Vector<bool,_4> local_44;
  undefined1 local_40 [8];
  IVec4 resPix;
  int x;
  int y;
  IVec4 refPix;
  ConstPixelBufferAccess *result_local;
  
  refPix.m_data._8_8_ = result;
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&x,0xff,0xff,0xff,0xff);
  resPix.m_data[3] = 0;
  do {
    iVar1 = resPix.m_data[3];
    iVar3 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)refPix.m_data._8_8_);
    if (iVar3 <= iVar1) {
      return true;
    }
    for (resPix.m_data[2] = 0; iVar1 = resPix.m_data[2],
        iVar3 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)refPix.m_data._8_8_)
        , iVar1 < iVar3; resPix.m_data[2] = resPix.m_data[2] + 1) {
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_40,refPix.m_data[2],resPix.m_data[2],
                 resPix.m_data[3]);
      tcu::notEqual<int,4>((tcu *)&local_44,(Vector<int,_4> *)local_40,(Vector<int,_4> *)&x);
      bVar2 = tcu::boolAny<4>(&local_44);
      if (bVar2) {
        return false;
      }
    }
    resPix.m_data[3] = resPix.m_data[3] + 1;
  } while( true );
}

Assistant:

bool checkResultImage (const ConstPixelBufferAccess& result)
{
	const tcu::IVec4	refPix	(255, 255, 255, 255);

	for (int y = 0; y < result.getHeight(); y++)
	{
		for (int x = 0; x < result.getWidth(); x++)
		{
			const tcu::IVec4	resPix	= result.getPixelInt(x, y);

			if (boolAny(notEqual(resPix, refPix)))
				return false;
		}
	}

	return true;
}